

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Track::set_codec_id(Track *this,char *codec_id)

{
  size_t sVar1;
  char *pcVar2;
  size_t length;
  char *codec_id_local;
  Track *this_local;
  
  if (codec_id != (char *)0x0) {
    if (this->codec_id_ != (char *)0x0) {
      operator_delete__(this->codec_id_);
    }
    sVar1 = strlen(codec_id);
    pcVar2 = (char *)operator_new__(sVar1 + 1,(nothrow_t *)&std::nothrow);
    this->codec_id_ = pcVar2;
    if (this->codec_id_ != (char *)0x0) {
      strcpy(this->codec_id_,codec_id);
    }
  }
  return;
}

Assistant:

void Track::set_codec_id(const char* codec_id) {
  if (codec_id) {
    delete[] codec_id_;

    const size_t length = strlen(codec_id) + 1;
    codec_id_ = new (std::nothrow) char[length];  // NOLINT
    if (codec_id_) {
#ifdef _MSC_VER
      strcpy_s(codec_id_, length, codec_id);
#else
      strcpy(codec_id_, codec_id);
#endif
    }
  }
}